

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

ON_OBSOLETE_V5_DimRadial *
ON_OBSOLETE_V5_DimRadial::CreateFromV2RadialDimension
          (ON_OBSOLETE_V2_DimRadial *V2_radial_dimension,ON_3dmAnnotationContext *annotation_context
          ,ON_OBSOLETE_V5_DimRadial *destination)

{
  undefined8 local_50;
  ON_OBSOLETE_V5_DimRadial *V5_radial_dimension;
  ON_OBSOLETE_V5_DimRadial *destination_local;
  ON_3dmAnnotationContext *annotation_context_local;
  ON_OBSOLETE_V2_DimRadial *V2_radial_dimension_local;
  
  local_50 = &destination->super_ON_OBSOLETE_V5_Annotation;
  if (destination == (ON_OBSOLETE_V5_DimRadial *)0x0) {
    local_50 = (ON_OBSOLETE_V5_Annotation *)operator_new(0xe0);
    ON_OBSOLETE_V5_DimRadial((ON_OBSOLETE_V5_DimRadial *)local_50);
  }
  ON_OBSOLETE_V5_Annotation::Internal_InitializeFromV2Annotation
            (local_50,&V2_radial_dimension->super_ON_OBSOLETE_V2_Annotation,annotation_context);
  return (ON_OBSOLETE_V5_DimRadial *)local_50;
}

Assistant:

ON_OBSOLETE_V5_DimRadial* ON_OBSOLETE_V5_DimRadial::CreateFromV2RadialDimension(
  const class ON_OBSOLETE_V2_DimRadial& V2_radial_dimension,
  const class ON_3dmAnnotationContext* annotation_context,
  ON_OBSOLETE_V5_DimRadial* destination
)
{
  ON_OBSOLETE_V5_DimRadial* V5_radial_dimension
    = (nullptr != destination)
    ? destination
    : new ON_OBSOLETE_V5_DimRadial();

  V5_radial_dimension->Internal_InitializeFromV2Annotation(V2_radial_dimension,annotation_context);

  return V5_radial_dimension;
}